

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

const_iterator __thiscall
QMap<unsigned_int,_unsigned_int>::find(QMap<unsigned_int,_unsigned_int> *this,uint *key)

{
  QMapData<std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QMapData<std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
                 *)0x0) {
    cVar2 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            ::find(&(pQVar1->m)._M_t,key);
    return (const_iterator)cVar2._M_node;
  }
  return (const_iterator)(_Base_ptr)0x0;
}

Assistant:

constexpr P get() const noexcept { return ptr; }